

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<int,_QXcbEventNode_*> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<int,_QXcbEventNode_*>_>::insert
          (Span<QHashPrivate::Node<int,_QXcbEventNode_*>_> *this,size_t i)

{
  byte bVar1;
  
  bVar1 = this->nextFree;
  if (bVar1 == this->allocated) {
    addStorage(this);
    bVar1 = this->nextFree;
  }
  this->nextFree = this->entries[bVar1].storage.data[0];
  this->offsets[i] = bVar1;
  return (Node<int,_QXcbEventNode_*> *)(this->entries + bVar1);
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }